

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion.c
# Opt level: O2

int ion_alloc(int fd,size_t len,size_t align,uint heap_mask,uint flags,ion_user_handle_t *handle)

{
  int iVar1;
  ion_allocation_data data;
  
  data.handle = 0;
  if (handle == (ion_user_handle_t *)0x0) {
    iVar1 = -0x16;
  }
  else {
    data.len = len;
    data.align = align;
    data.heap_id_mask = heap_mask;
    data.flags = flags;
    iVar1 = ion_ioctl(fd,-0x3fdfb700,&data);
    if (-1 < iVar1) {
      *handle = data.handle;
    }
  }
  return iVar1;
}

Assistant:

int ion_alloc(int fd, size_t len, size_t align, unsigned int heap_mask,
	      unsigned int flags, ion_user_handle_t *handle)
{
	int ret;
	struct ion_allocation_data data = {
		.len		= len,
		.align		= align,
		.heap_id_mask	= heap_mask,
		.flags		= flags,
	};

	if (handle == NULL)
		return -EINVAL;

	ret = ion_ioctl(fd, ION_IOC_ALLOC, &data);
	if (ret < 0)
		return ret;
	*handle = data.handle;
	return ret;
}